

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcarray.c
# Opt level: O0

LispPTR get_package_atom(char *char_base,DLword charlen,char *packname,DLword packlen,int externalp)

{
  int iVar1;
  LispPTR LAddr;
  LispPTR *pLVar2;
  LispPTR index;
  PACKAGE *packaddr;
  int packindex;
  int externalp_local;
  DLword packlen_local;
  char *packname_local;
  DLword charlen_local;
  char *char_base_local;
  
  iVar1 = strncmp(packname,"XCL",(ulong)packlen);
  if (iVar1 == 0) {
    packaddr._4_4_ = find_package_from_name("XEROX-COMMON-LISP",0x11);
  }
  else {
    iVar1 = strncmp(packname,"SI",(ulong)packlen);
    if (iVar1 == 0) {
      packaddr._4_4_ = find_package_from_name("SYSTEM",6);
    }
    else {
      iVar1 = strncmp(packname,"CL",(ulong)packlen);
      if (iVar1 == 0) {
        packaddr._4_4_ = find_package_from_name("LISP",4);
      }
      else {
        iVar1 = strncmp(packname,"XCLC",(ulong)packlen);
        if (iVar1 == 0) {
          packaddr._4_4_ = find_package_from_name("COMPILER",8);
        }
        else {
          packaddr._4_4_ = find_package_from_name(packname,(uint)packlen);
        }
      }
    }
  }
  if (packaddr._4_4_ < 0) {
    printf("getting package index failed %s:%s\n",packname,char_base);
    char_base_local._4_4_ = 0xffffffff;
  }
  else {
    LAddr = aref1(*Package_from_Index_word,packaddr._4_4_);
    pLVar2 = NativeAligned4FromLAddr(LAddr);
    char_base_local._4_4_ = find_symbol(char_base,0,charlen,pLVar2[9],0,0);
    if (char_base_local._4_4_ == 0xffffffff) {
      char_base_local._4_4_ = find_symbol(char_base,0,charlen,pLVar2[8],0,0);
    }
  }
  return char_base_local._4_4_;
}

Assistant:

LispPTR get_package_atom(const char *char_base, DLword charlen, const char *packname, DLword packlen,
                         int externalp) {
  int packindex;
  PACKAGE *packaddr;
  /* LispPTR hashtbladdr; */
  LispPTR index;

  /* For convenience, recognize the common package nicknames: */

  if (0 == strncmp(packname, "XCL", packlen))
    packindex = find_package_from_name("XEROX-COMMON-LISP", 17);
  else if (0 == strncmp(packname, "SI", packlen))
    packindex = find_package_from_name("SYSTEM", 6);
  else if (0 == strncmp(packname, "CL", packlen))
    packindex = find_package_from_name("LISP", 4);
  else if (0 == strncmp(packname, "XCLC", packlen))
    packindex = find_package_from_name("COMPILER", 8);

  /**** else if (0 == strncmp(packname, "KEYWORD", packlen))
      packindex = 7;***/

  else
    packindex = find_package_from_name(packname, packlen);

  if (packindex < 0) {
    printf("getting package index failed %s:%s\n", packname, char_base);
    return (0xffffffff);
  }

  /* if (packindex != 7)  Not necessary (Take)*/
  packaddr = (PACKAGE *)NativeAligned4FromLAddr(aref1(*Package_from_Index_word, packindex));
  /* else packaddr = (PACKAGE *)NativeAligned4FromLAddr(
                          *Keyword_Package_word);	*/
  /* hashtbladdr =	((externalp == T)?(packaddr->EXTERNAL_SYMBOLS):
                           (packaddr->INTERNAL_SYMBOLS));
   return( find_symbol(char_base, 0, charlen, hashtbladdr, 0, 0) );*/

  if ((index = find_symbol(char_base, 0, charlen, packaddr->EXTERNAL_SYMBOLS, 0, 0)) != 0xffffffff)
    return (index);
  else
    return (find_symbol(char_base, 0, charlen, packaddr->INTERNAL_SYMBOLS, 0, 0));
}